

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
irwincolor::sortidx<double>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v)

{
  size_type __n;
  iterator iVar1;
  iterator iVar2;
  allocator<unsigned_int> local_1a;
  undefined1 local_19;
  anon_class_8_1_54a39816 local_18;
  vector<double,_std::allocator<double>_> *v_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *idx;
  
  local_19 = 0;
  local_18.v = v;
  v_local = (vector<double,_std::allocator<double>_> *)__return_storage_ptr__;
  __n = std::vector<double,_std::allocator<double>_>::size(v);
  std::allocator<unsigned_int>::allocator(&local_1a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_1a);
  std::allocator<unsigned_int>::~allocator(&local_1a);
  iVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar1._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar2._M_current,0);
  iVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,irwincolor::sortidx<double>(std::vector<double,std::allocator<double>>const&)::_lambda(unsigned_int,unsigned_int)_1_>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar1._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar2._M_current,local_18);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> sortidx(const std::vector<T>& v)
{
	// Instead of sorting a vector v, sort an index array that gives
	// the ascending sorted values v[idx[0: ]].

	// initialize original index locations
	std::vector<unsigned int> idx(v.size());
	std::iota(idx.begin(), idx.end(), 0);

	// sort indices based on comparing values in v
	std::sort(idx.begin(), idx.end(), [&v](unsigned int i1, unsigned int i2) {return v[i1] < v[i2];});

	return idx;
}